

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXFTypes.cpp
# Opt level: O3

TLVReader * __thiscall
ASDCP::MXF::TLVReader::ReadUi32(TLVReader *this,MDDEntry *Entry,ui32_t *value)

{
  uint uVar1;
  bool bVar2;
  uint *in_RCX;
  undefined1 *puVar3;
  
  if (in_RCX == (uint *)0x0) {
    puVar3 = Kumu::RESULT_PTR;
  }
  else {
    bVar2 = FindTL((TLVReader *)Entry,(MDDEntry *)value);
    if (bVar2) {
      if ((ulong)*(uint *)(Entry->ul + 8) < (ulong)*(uint *)(Entry->ul + 0xc) + 4) {
        Kumu::Result_t::operator()((int *)this,Kumu::RESULT_FALSE);
        return this;
      }
      uVar1 = *(uint *)(*(long *)Entry->ul + (ulong)*(uint *)(Entry->ul + 0xc));
      *in_RCX = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
      *(int *)(Entry->ul + 0xc) = *(int *)(Entry->ul + 0xc) + 4;
      puVar3 = (undefined1 *)&Kumu::RESULT_OK;
    }
    else {
      puVar3 = Kumu::RESULT_FALSE;
    }
  }
  Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)puVar3);
  return this;
}

Assistant:

ASDCP::Result_t
ASDCP::MXF::TLVReader::ReadUi32(const MDDEntry& Entry, ui32_t* value)
{
  ASDCP_TEST_NULL(value);

  if ( FindTL(Entry) )
    return MemIOReader::ReadUi32BE(value) ? RESULT_OK : RESULT_FALSE(__LINE__, __FILE__);

  return RESULT_FALSE;
}